

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::selection_statement(Parser *this)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *this_00;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  Lexer::next_token(this->lex);
  pNVar2 = expression(this);
  eat_abi_cxx11_(&local_40,this,LBRACE);
  std::__cxx11::string::~string((string *)&local_40);
  pNVar3 = compound_statement(this);
  this_00 = (Node *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_60,"",&local_81);
  Node::Node(this_00,IF,pNVar2,pNVar3,&local_60,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = tryEat(this,ELSE);
  if (bVar1) {
    Lexer::next_token(this->lex);
    pNVar2 = compound_statement(this);
    pNVar3 = (Node *)operator_new(0x48);
    std::__cxx11::string::string((string *)&local_80,"",&local_81);
    Node::Node(pNVar3,ELSE,pNVar2,(Node *)0x0,&local_80,(Node *)0x0,(Node *)0x0);
    std::__cxx11::string::~string((string *)&local_80);
    this_00->operand3 = pNVar3;
  }
  return this_00;
}

Assistant:

Node* Parser::selection_statement()
{
	lex->next_token();

	Node* expression_node = expression();

	eat(token_type::LBRACE);
	Node* compound_node = compound_statement();

	Node* selection_node = new Node(node_type::IF, expression_node, compound_node);

	if (tryEat(token_type::ELSE)) {
		lex->next_token();

		Node* compound_else_node = compound_statement();
		Node* else_node = new Node(node_type::ELSE, compound_else_node);
		selection_node->operand3 = else_node;
	}

	return selection_node;
}